

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPU.cpp
# Opt level: O0

void __thiscall PPU::spritePixel(PPU *this,uint8_t *index,uint8_t *sprite)

{
  byte bVar1;
  int iVar2;
  uint8_t color;
  int offset;
  int i;
  uint8_t *sprite_local;
  uint8_t *index_local;
  PPU *this_local;
  
  if ((this->PPUMASK & 0x10) == 0) {
    *index = '\0';
    *sprite = '\0';
  }
  else {
    for (i = 0; i < this->spriteCount; i = i + 1) {
      iVar2 = (this->cycle + -1) - (uint)this->spritePositions[i];
      if (((-1 < iVar2) && (iVar2 < 8)) &&
         (bVar1 = (byte)(this->spritePatterns[i] >> (('\a' - (char)iVar2) * '\x04' & 0x1fU)) & 0xf,
         (uint)bVar1 % 4 != 0)) {
        *index = (uint8_t)i;
        *sprite = bVar1;
        return;
      }
    }
    *index = '\0';
    *sprite = '\0';
  }
  return;
}

Assistant:

void PPU::spritePixel(uint8_t &index, uint8_t &sprite) {
    if (!(PPUMASK & flagShowSprites)) {
        index = 0;
        sprite = 0;
        return;
    }
    for (int i = 0; i < spriteCount; i++) {
        int offset = (cycle - 1) - spritePositions[i];
        if (offset < 0 || offset > 7) {
            continue;
        }
        offset = 7 - offset;
        uint8_t color = uint8_t((spritePatterns[i] >> (offset * 4)) & 0x0F);
        if ((color % 4) == 0) {
            continue;
        }
        index = i;
        sprite = color;
        return;
    }
    index = 0;
    sprite = 0;
    return;
}